

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O0

void Wln_WriteAddPos(Wln_Ntk_t *p)

{
  int iVar1;
  undefined4 local_14;
  int iObj;
  Wln_Ntk_t *p_local;
  
  local_14 = 1;
  while( true ) {
    iVar1 = Wln_NtkObjNum(p);
    if (iVar1 <= local_14) break;
    iVar1 = Wln_ObjIsCio(p,local_14);
    if (iVar1 == 0) {
      Wln_ObjCreateCo(p,local_14);
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void Wln_WriteAddPos( Wln_Ntk_t * p )
{
    int iObj;
    Wln_NtkForEachObj( p, iObj )
        if ( !Wln_ObjIsCio(p, iObj) )
            Wln_ObjCreateCo( p, iObj );
}